

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelFixedSamplesCase::checkTextureState
          (TextureLevelFixedSamplesCase *this,CallLogWrapper *gl,TextureGenerationSpec *spec)

{
  bool bVar1;
  const_reference pvVar2;
  uint local_38;
  int local_34;
  int refValue;
  int queryLevel;
  TextureGenerationSpec *spec_local;
  CallLogWrapper *gl_local;
  TextureLevelFixedSamplesCase *this_local;
  
  bVar1 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
          ::empty(&spec->levels);
  if (bVar1) {
    local_34 = 0;
  }
  else {
    pvVar2 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
             ::operator[](&spec->levels,0);
    local_34 = pvVar2->level;
  }
  bVar1 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
          ::empty(&spec->levels);
  if (bVar1) {
    local_38 = 1;
  }
  else {
    local_38 = (uint)((spec->fixedSamplePos & 1U) != 0);
  }
  bVar1 = verifyTextureLevelParameterEqual
                    (gl,spec->queryTarget,local_34,0x9107,local_38,
                     (this->super_TextureLevelCommonCase).super_TextureLevelCase.m_type);
  return bVar1;
}

Assistant:

bool checkTextureState (glu::CallLogWrapper& gl, const TextureGenerationSpec& spec)
	{
		const int queryLevel	= (spec.levels.empty()) ? (0) : (spec.levels[0].level);
		const int refValue		= (spec.levels.empty()) ? (1) : ((spec.fixedSamplePos) ? (1) : (0));

		return verifyTextureLevelParameterEqual(gl, spec.queryTarget, queryLevel, GL_TEXTURE_FIXED_SAMPLE_LOCATIONS, refValue, m_type);
	}